

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseModifier(sqlite3_context *pCtx,char *zMod,DateTime *p)

{
  int iVar1;
  sqlite3_int64 sVar2;
  sqlite3_int64 sVar3;
  byte *z_00;
  bool bVar4;
  double dVar5;
  double dVar6;
  int local_e0;
  int y_1;
  int y;
  int x;
  sqlite3_int64 day;
  DateTime tx;
  char *z2;
  double rRounder;
  sqlite3_int64 Z;
  sqlite3_int64 c1;
  char zBuf [30];
  char *z;
  double r;
  int n;
  int rc;
  DateTime *p_local;
  char *zMod_local;
  sqlite3_context *pCtx_local;
  
  r._4_4_ = 1;
  r._0_4_ = 0;
  while( true ) {
    bVar4 = false;
    if (r._0_4_ < 0x1d) {
      bVar4 = zMod[r._0_4_] != '\0';
    }
    if (!bVar4) break;
    *(uchar *)((long)&c1 + (long)r._0_4_) = ""[(byte)zMod[r._0_4_]];
    r._0_4_ = r._0_4_ + 1;
  }
  *(byte *)((long)&c1 + (long)r._0_4_) = 0;
  unique0x10000953 = (byte *)&c1;
  _n = p;
  p_local = (DateTime *)zMod;
  zMod_local = (char *)pCtx;
  switch((undefined1)c1) {
  case 0x2b:
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    r._0_4_ = 1;
    while( true ) {
      bVar4 = false;
      if ((*(byte *)((long)&c1 + (long)r._0_4_) != 0) &&
         (bVar4 = false, *(byte *)((long)&c1 + (long)r._0_4_) != 0x3a)) {
        bVar4 = (""[*(byte *)((long)&c1 + (long)r._0_4_)] & 1) == 0;
      }
      if (!bVar4) break;
      r._0_4_ = r._0_4_ + 1;
    }
    iVar1 = sqlite3AtoF((char *)&c1,(double *)&z,r._0_4_,'\x01');
    if (iVar1 == 0) {
      r._4_4_ = 1;
    }
    else if (stack0xffffffffffffffc8[r._0_4_] == 0x3a) {
      tx._40_8_ = stack0xffffffffffffffc8;
      if ((""[*stack0xffffffffffffffc8] & 4) == 0) {
        tx._40_8_ = stack0xffffffffffffffc8 + 1;
      }
      memset(&day,0,0x30);
      iVar1 = parseHhMmSs((char *)tx._40_8_,(DateTime *)&day);
      if (iVar1 == 0) {
        computeJD((DateTime *)&day);
        day = (day + -43200000) % 86400000;
        if (*stack0xffffffffffffffc8 == 0x2d) {
          day = -day;
        }
        computeJD(_n);
        clearYMD_HMS_TZ(_n);
        _n->iJD = day + _n->iJD;
        r._4_4_ = 0;
      }
    }
    else {
      register0x00000000 = stack0xffffffffffffffc8 + r._0_4_;
      while ((""[*stack0xffffffffffffffc8] & 1) != 0) {
        register0x00000000 = stack0xffffffffffffffc8 + 1;
      }
      r._0_4_ = sqlite3Strlen30((char *)stack0xffffffffffffffc8);
      if ((r._0_4_ < 0xb) && (2 < r._0_4_)) {
        if (stack0xffffffffffffffc8[r._0_4_ + -1] == 0x73) {
          stack0xffffffffffffffc8[r._0_4_ + -1] = 0;
          r._0_4_ = r._0_4_ + -1;
        }
        computeJD(_n);
        r._4_4_ = 0;
        dVar5 = (double)(~-(ulong)((double)z < 0.0) & 0x3fe0000000000000 |
                        (ulong)((uint)(-(ulong)((double)z < 0.0) >> 0x20) & 0xbfe00000) << 0x20);
        if ((r._0_4_ == 3) && (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"day"), iVar1 == 0)) {
          _n->iJD = (long)((double)z * 86400000.0 + dVar5) + _n->iJD;
        }
        else if ((r._0_4_ == 4) &&
                (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"hour"), iVar1 == 0)) {
          _n->iJD = (long)((double)z * 3600000.0 + dVar5) + _n->iJD;
        }
        else if ((r._0_4_ == 6) &&
                (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"minute"), iVar1 == 0)) {
          _n->iJD = (long)((double)z * 60000.0 + dVar5) + _n->iJD;
        }
        else if ((r._0_4_ == 6) &&
                (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"second"), iVar1 == 0)) {
          _n->iJD = (long)((double)z * 1000.0 + dVar5) + _n->iJD;
        }
        else if ((r._0_4_ == 5) &&
                (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"month"), iVar1 == 0)) {
          computeYMD_HMS(_n);
          _n->M = (int)(double)z + _n->M;
          if (_n->M < 1) {
            local_e0 = _n->M + -0xc;
          }
          else {
            local_e0 = _n->M + -1;
          }
          local_e0 = local_e0 / 0xc;
          _n->Y = local_e0 + _n->Y;
          _n->M = _n->M + local_e0 * -0xc;
          _n->validJD = '\0';
          computeJD(_n);
          dVar6 = (double)(int)(double)z;
          if ((dVar6 != (double)z) || (NAN(dVar6) || NAN((double)z))) {
            _n->iJD = (long)(((double)z - (double)(int)(double)z) * 30.0 * 86400000.0 + dVar5) +
                      _n->iJD;
          }
        }
        else if ((r._0_4_ == 4) &&
                (iVar1 = strcmp((char *)stack0xffffffffffffffc8,"year"), iVar1 == 0)) {
          iVar1 = (int)(double)z;
          computeYMD_HMS(_n);
          _n->Y = iVar1 + _n->Y;
          _n->validJD = '\0';
          computeJD(_n);
          if (((double)iVar1 != (double)z) || (NAN((double)iVar1) || NAN((double)z))) {
            _n->iJD = (long)(((double)z - (double)iVar1) * 365.0 * 86400000.0 + dVar5) + _n->iJD;
          }
        }
        else {
          r._4_4_ = 1;
        }
        clearYMD_HMS_TZ(_n);
      }
    }
    break;
  default:
    break;
  case 0x6c:
    iVar1 = strcmp((char *)&c1,"localtime");
    if (iVar1 == 0) {
      computeJD(_n);
      sVar2 = localtimeOffset(_n,(sqlite3_context *)zMod_local,(int *)((long)&r + 4));
      _n->iJD = sVar2 + _n->iJD;
      clearYMD_HMS_TZ(_n);
    }
    break;
  case 0x73:
    iVar1 = strncmp((char *)&c1,"start of ",9);
    if (iVar1 == 0) {
      register0x00000000 = stack0xffffffffffffffc8 + 9;
      computeYMD(_n);
      _n->validHMS = '\x01';
      _n->m = 0;
      _n->h = 0;
      _n->s = 0.0;
      _n->validTZ = '\0';
      _n->validJD = '\0';
      iVar1 = strcmp((char *)stack0xffffffffffffffc8,"month");
      if (iVar1 == 0) {
        _n->D = 1;
        r._4_4_ = 0;
      }
      else {
        iVar1 = strcmp((char *)stack0xffffffffffffffc8,"year");
        if (iVar1 == 0) {
          computeYMD(_n);
          _n->M = 1;
          _n->D = 1;
          r._4_4_ = 0;
        }
        else {
          iVar1 = strcmp((char *)stack0xffffffffffffffc8,"day");
          if (iVar1 == 0) {
            r._4_4_ = 0;
          }
        }
      }
    }
    break;
  case 0x75:
    iVar1 = strcmp((char *)&c1,"unixepoch");
    if ((iVar1 == 0) && (_n->validJD != '\0')) {
      _n->iJD = (_n->iJD + 0xa8c0) / 0x15180 + 0xbfc83e532200;
      clearYMD_HMS_TZ(_n);
      r._4_4_ = 0;
    }
    else {
      iVar1 = strcmp((char *)stack0xffffffffffffffc8,"utc");
      if (iVar1 == 0) {
        computeJD(_n);
        sVar2 = localtimeOffset(_n,(sqlite3_context *)zMod_local,(int *)((long)&r + 4));
        if (r._4_4_ == 0) {
          _n->iJD = _n->iJD - sVar2;
          clearYMD_HMS_TZ(_n);
          sVar3 = localtimeOffset(_n,(sqlite3_context *)zMod_local,(int *)((long)&r + 4));
          _n->iJD = (sVar2 - sVar3) + _n->iJD;
        }
      }
    }
    break;
  case 0x77:
    iVar1 = strncmp((char *)&c1,"weekday ",8);
    if (iVar1 == 0) {
      z_00 = stack0xffffffffffffffc8 + 8;
      iVar1 = sqlite3Strlen30((char *)(stack0xffffffffffffffc8 + 8));
      iVar1 = sqlite3AtoF((char *)z_00,(double *)&z,iVar1,'\x01');
      if (iVar1 != 0) {
        r._0_4_ = (int)(double)z;
        if (((((double)r._0_4_ == (double)z) && (!NAN((double)r._0_4_) && !NAN((double)z))) &&
            (-1 < r._0_4_)) && ((double)z < 7.0)) {
          computeYMD_HMS(_n);
          _n->validTZ = '\0';
          _n->validJD = '\0';
          computeJD(_n);
          rRounder = (double)(((_n->iJD + 0x7b98a00) / 86400000) % 7);
          if ((long)r._0_4_ < (long)rRounder) {
            rRounder = (double)((long)rRounder + -7);
          }
          _n->iJD = ((long)r._0_4_ - (long)rRounder) * 86400000 + _n->iJD;
          clearYMD_HMS_TZ(_n);
          r._4_4_ = 0;
        }
      }
    }
  }
  return r._4_4_;
}

Assistant:

static int parseModifier(sqlite3_context *pCtx, const char *zMod, DateTime *p){
  int rc = 1;
  int n;
  double r;
  char *z, zBuf[30];
  z = zBuf;
  for(n=0; n<ArraySize(zBuf)-1 && zMod[n]; n++){
    z[n] = (char)sqlite3UpperToLower[(u8)zMod[n]];
  }
  z[n] = 0;
  switch( z[0] ){
#ifndef SQLITE_OMIT_LOCALTIME
    case 'l': {
      /*    localtime
      **
      ** Assuming the current time value is UTC (a.k.a. GMT), shift it to
      ** show local time.
      */
      if( strcmp(z, "localtime")==0 ){
        computeJD(p);
        p->iJD += localtimeOffset(p, pCtx, &rc);
        clearYMD_HMS_TZ(p);
      }
      break;
    }
#endif
    case 'u': {
      /*
      **    unixepoch
      **
      ** Treat the current value of p->iJD as the number of
      ** seconds since 1970.  Convert to a real julian day number.
      */
      if( strcmp(z, "unixepoch")==0 && p->validJD ){
        p->iJD = (p->iJD + 43200)/86400 + 21086676*(i64)10000000;
        clearYMD_HMS_TZ(p);
        rc = 0;
      }
#ifndef SQLITE_OMIT_LOCALTIME
      else if( strcmp(z, "utc")==0 ){
        sqlite3_int64 c1;
        computeJD(p);
        c1 = localtimeOffset(p, pCtx, &rc);
        if( rc==SQLITE_OK ){
          p->iJD -= c1;
          clearYMD_HMS_TZ(p);
          p->iJD += c1 - localtimeOffset(p, pCtx, &rc);
        }
      }
#endif
      break;
    }
    case 'w': {
      /*
      **    weekday N
      **
      ** Move the date to the same time on the next occurrence of
      ** weekday N where 0==Sunday, 1==Monday, and so forth.  If the
      ** date is already on the appropriate weekday, this is a no-op.
      */
      if( strncmp(z, "weekday ", 8)==0
               && sqlite3AtoF(&z[8], &r, sqlite3Strlen30(&z[8]), SQLITE_UTF8)
               && (n=(int)r)==r && n>=0 && r<7 ){
        sqlite3_int64 Z;
        computeYMD_HMS(p);
        p->validTZ = 0;
        p->validJD = 0;
        computeJD(p);
        Z = ((p->iJD + 129600000)/86400000) % 7;
        if( Z>n ) Z -= 7;
        p->iJD += (n - Z)*86400000;
        clearYMD_HMS_TZ(p);
        rc = 0;
      }
      break;
    }
    case 's': {
      /*
      **    start of TTTTT
      **
      ** Move the date backwards to the beginning of the current day,
      ** or month or year.
      */
      if( strncmp(z, "start of ", 9)!=0 ) break;
      z += 9;
      computeYMD(p);
      p->validHMS = 1;
      p->h = p->m = 0;
      p->s = 0.0;
      p->validTZ = 0;
      p->validJD = 0;
      if( strcmp(z,"month")==0 ){
        p->D = 1;
        rc = 0;
      }else if( strcmp(z,"year")==0 ){
        computeYMD(p);
        p->M = 1;
        p->D = 1;
        rc = 0;
      }else if( strcmp(z,"day")==0 ){
        rc = 0;
      }
      break;
    }
    case '+':
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
      double rRounder;
      for(n=1; z[n] && z[n]!=':' && !sqlite3Isspace(z[n]); n++){}
      if( !sqlite3AtoF(z, &r, n, SQLITE_UTF8) ){
        rc = 1;
        break;
      }
      if( z[n]==':' ){
        /* A modifier of the form (+|-)HH:MM:SS.FFF adds (or subtracts) the
        ** specified number of hours, minutes, seconds, and fractional seconds
        ** to the time.  The ".FFF" may be omitted.  The ":SS.FFF" may be
        ** omitted.
        */
        const char *z2 = z;
        DateTime tx;
        sqlite3_int64 day;
        if( !sqlite3Isdigit(*z2) ) z2++;
        memset(&tx, 0, sizeof(tx));
        if( parseHhMmSs(z2, &tx) ) break;
        computeJD(&tx);
        tx.iJD -= 43200000;
        day = tx.iJD/86400000;
        tx.iJD -= day*86400000;
        if( z[0]=='-' ) tx.iJD = -tx.iJD;
        computeJD(p);
        clearYMD_HMS_TZ(p);
        p->iJD += tx.iJD;
        rc = 0;
        break;
      }
      z += n;
      while( sqlite3Isspace(*z) ) z++;
      n = sqlite3Strlen30(z);
      if( n>10 || n<3 ) break;
      if( z[n-1]=='s' ){ z[n-1] = 0; n--; }
      computeJD(p);
      rc = 0;
      rRounder = r<0 ? -0.5 : +0.5;
      if( n==3 && strcmp(z,"day")==0 ){
        p->iJD += (sqlite3_int64)(r*86400000.0 + rRounder);
      }else if( n==4 && strcmp(z,"hour")==0 ){
        p->iJD += (sqlite3_int64)(r*(86400000.0/24.0) + rRounder);
      }else if( n==6 && strcmp(z,"minute")==0 ){
        p->iJD += (sqlite3_int64)(r*(86400000.0/(24.0*60.0)) + rRounder);
      }else if( n==6 && strcmp(z,"second")==0 ){
        p->iJD += (sqlite3_int64)(r*(86400000.0/(24.0*60.0*60.0)) + rRounder);
      }else if( n==5 && strcmp(z,"month")==0 ){
        int x, y;
        computeYMD_HMS(p);
        p->M += (int)r;
        x = p->M>0 ? (p->M-1)/12 : (p->M-12)/12;
        p->Y += x;
        p->M -= x*12;
        p->validJD = 0;
        computeJD(p);
        y = (int)r;
        if( y!=r ){
          p->iJD += (sqlite3_int64)((r - y)*30.0*86400000.0 + rRounder);
        }
      }else if( n==4 && strcmp(z,"year")==0 ){
        int y = (int)r;
        computeYMD_HMS(p);
        p->Y += y;
        p->validJD = 0;
        computeJD(p);
        if( y!=r ){
          p->iJD += (sqlite3_int64)((r - y)*365.0*86400000.0 + rRounder);
        }
      }else{
        rc = 1;
      }
      clearYMD_HMS_TZ(p);
      break;
    }
    default: {
      break;
    }
  }
  return rc;
}